

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O2

vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> * __thiscall
tiger::trains::world::Point::getTrains
          (vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
           *__return_storage_ptr__,Point *this)

{
  pointer ppTVar1;
  vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_> *pvVar2;
  Point *pPVar3;
  pointer ppTVar4;
  Train *train;
  Train *local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = World::getTrainList(this->owner);
  ppTVar1 = (pvVar2->
            super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar4 = (pvVar2->
                 super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppTVar4 != ppTVar1;
      ppTVar4 = ppTVar4 + 1) {
    local_30 = *ppTVar4;
    pPVar3 = Train::getPoint(local_30);
    if (pPVar3 == this) {
      std::vector<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>::
      push_back(__return_storage_ptr__,&local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<Train *> Point::getTrains() const
{
    std::vector<Train *> res;

    for (Train *train : owner->getTrainList())
        if (train->getPoint() == this)
            res.push_back(train);

    return res;
}